

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_intersector_virtual_4v.cpp
# Opt level: O2

VirtualCurveIntersector * embree::avx::VirtualCurveIntersector4v(void)

{
  int iVar1;
  
  if ((VirtualCurveIntersector4v()::function_local_static_prim == '\0') &&
     (iVar1 = __cxa_guard_acquire(&VirtualCurveIntersector4v()::function_local_static_prim),
     iVar1 != 0)) {
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x19].intersect1 =
         SphereMiIntersector1<4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x19].occluded1 =
         SphereMiIntersector1<4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x19].intersect4 =
         SphereMiIntersectorK<4,_4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x19].occluded4 =
         SphereMiIntersectorK<4,_4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x19].intersect8 =
         SphereMiIntersectorK<4,_8,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x19].occluded8 =
         SphereMiIntersectorK<4,_8,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1a].intersect1 =
         DiscMiIntersector1<4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1a].occluded1 =
         DiscMiIntersector1<4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1a].intersect4 =
         DiscMiIntersectorK<4,_4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1a].occluded4 =
         DiscMiIntersectorK<4,_4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1a].intersect8 =
         DiscMiIntersectorK<4,_8,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1a].occluded8 =
         DiscMiIntersectorK<4,_8,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1b].intersect1 =
         OrientedDiscMiIntersector1<4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1b].occluded1 =
         OrientedDiscMiIntersector1<4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1b].intersect4 =
         OrientedDiscMiIntersectorK<4,_4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1b].occluded4 =
         OrientedDiscMiIntersectorK<4,_4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1b].intersect8 =
         OrientedDiscMiIntersectorK<4,_8,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x1b].occluded8 =
         OrientedDiscMiIntersectorK<4,_8,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[3].intersect1 =
         ConeCurveMiIntersector1<4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[3].occluded1 =
         ConeCurveMiIntersector1<4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[3].intersect4 =
         ConeCurveMiIntersectorK<4,_4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[3].occluded4 =
         ConeCurveMiIntersectorK<4,_4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[3].intersect8 =
         ConeCurveMiIntersectorK<4,_8,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[3].occluded8 =
         ConeCurveMiIntersectorK<4,_8,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[1].intersect1 =
         RoundLinearCurveMiIntersector1<4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[1].occluded1 =
         RoundLinearCurveMiIntersector1<4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[1].intersect4 =
         RoundLinearCurveMiIntersectorK<4,_4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[1].occluded4 =
         RoundLinearCurveMiIntersectorK<4,_4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[1].intersect8 =
         RoundLinearCurveMiIntersectorK<4,_8,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[1].occluded8 =
         RoundLinearCurveMiIntersectorK<4,_8,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0].intersect1 =
         FlatLinearCurveMiIntersector1<4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0].occluded1 =
         FlatLinearCurveMiIntersector1<4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0].intersect4 =
         FlatLinearCurveMiIntersectorK<4,_4,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0].occluded4 =
         FlatLinearCurveMiIntersectorK<4,_4,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0].intersect8 =
         FlatLinearCurveMiIntersectorK<4,_8,_true>::intersect;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0].occluded8 =
         FlatLinearCurveMiIntersectorK<4,_8,_true>::occluded;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[5].intersect1 =
         CurveNvIntersector1<4>::
         intersect_t<embree::avx::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[5].occluded1 =
         CurveNvIntersector1<4>::
         occluded_t<embree::avx::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[5].intersect4 =
         CurveNvIntersectorK<4,4>::
         intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[5].occluded4 =
         CurveNvIntersectorK<4,4>::
         occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[5].intersect8 =
         CurveNvIntersectorK<4,8>::
         intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[5].occluded8 =
         CurveNvIntersectorK<4,8>::
         occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[4].intersect1 =
         CurveNvIntersector1<4>::
         intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[4].occluded1 =
         CurveNvIntersector1<4>::
         occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[4].intersect4 =
         CurveNvIntersectorK<4,4>::
         intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[4].occluded4 =
         CurveNvIntersectorK<4,4>::
         occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[4].intersect8 =
         CurveNvIntersectorK<4,8>::
         intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[4].occluded8 =
         CurveNvIntersectorK<4,8>::
         occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[6].intersect1 =
         CurveNiIntersector1<4>::
         intersect_n<embree::avx::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[6].occluded1 =
         CurveNiIntersector1<4>::
         occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[6].intersect4 =
         CurveNiIntersectorK<4,4>::
         intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[6].occluded4 =
         CurveNiIntersectorK<4,4>::
         occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[6].intersect8 =
         CurveNiIntersectorK<4,8>::
         intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[6].occluded8 =
         CurveNiIntersectorK<4,8>::
         occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[9].intersect1 =
         CurveNvIntersector1<4>::
         intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[9].occluded1 =
         CurveNvIntersector1<4>::
         occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[9].intersect4 =
         CurveNvIntersectorK<4,4>::
         intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[9].occluded4 =
         CurveNvIntersectorK<4,4>::
         occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[9].intersect8 =
         CurveNvIntersectorK<4,8>::
         intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[9].occluded8 =
         CurveNvIntersectorK<4,8>::
         occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[8].intersect1 =
         CurveNvIntersector1<4>::
         intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[8].occluded1 =
         CurveNvIntersector1<4>::
         occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[8].intersect4 =
         CurveNvIntersectorK<4,4>::
         intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[8].occluded4 =
         CurveNvIntersectorK<4,4>::
         occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[8].intersect8 =
         CurveNvIntersectorK<4,8>::
         intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[8].occluded8 =
         CurveNvIntersectorK<4,8>::
         occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[10].intersect1 =
         CurveNiIntersector1<4>::
         intersect_n<embree::avx::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[10].occluded1 =
         CurveNiIntersector1<4>::
         occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[10].intersect4 =
         CurveNiIntersectorK<4,4>::
         intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[10].occluded4 =
         CurveNiIntersectorK<4,4>::
         occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[10].intersect8 =
         CurveNiIntersectorK<4,8>::
         intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[10].occluded8 =
         CurveNiIntersectorK<4,8>::
         occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xd].intersect1 =
         CurveNiIntersector1<4>::
         intersect_h<embree::avx::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xd].occluded1 =
         CurveNiIntersector1<4>::
         occluded_h<embree::avx::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xd].intersect4 =
         CurveNiIntersectorK<4,4>::
         intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xd].occluded4 =
         CurveNiIntersectorK<4,4>::
         occluded_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xd].intersect8 =
         CurveNiIntersectorK<4,8>::
         intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xd].occluded8 =
         CurveNiIntersectorK<4,8>::
         occluded_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xc].intersect1 =
         CurveNiIntersector1<4>::
         intersect_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xc].occluded1 =
         CurveNiIntersector1<4>::
         occluded_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xc].intersect4 =
         CurveNiIntersectorK<4,4>::
         intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xc].occluded4 =
         CurveNiIntersectorK<4,4>::
         occluded_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xc].intersect8 =
         CurveNiIntersectorK<4,8>::
         intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xc].occluded8 =
         CurveNiIntersectorK<4,8>::
         occluded_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xe].intersect1 =
         CurveNiIntersector1<4>::
         intersect_hn<embree::avx::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xe].occluded1 =
         CurveNiIntersector1<4>::
         occluded_hn<embree::avx::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xe].intersect4 =
         CurveNiIntersectorK<4,4>::
         intersect_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xe].occluded4 =
         CurveNiIntersectorK<4,4>::
         occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xe].intersect8 =
         CurveNiIntersectorK<4,8>::
         intersect_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0xe].occluded8 =
         CurveNiIntersectorK<4,8>::
         occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x11].intersect1 =
         CurveNiIntersector1<4>::
         intersect_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x11].occluded1 =
         CurveNiIntersector1<4>::
         occluded_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x11].intersect4 =
         CurveNiIntersectorK<4,4>::
         intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x11].occluded4 =
         CurveNiIntersectorK<4,4>::
         occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x11].intersect8 =
         CurveNiIntersectorK<4,8>::
         intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x11].occluded8 =
         CurveNiIntersectorK<4,8>::
         occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x10].intersect1 =
         CurveNiIntersector1<4>::
         intersect_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x10].occluded1 =
         CurveNiIntersector1<4>::
         occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x10].intersect4 =
         CurveNiIntersectorK<4,4>::
         intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x10].occluded4 =
         CurveNiIntersectorK<4,4>::
         occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x10].intersect8 =
         CurveNiIntersectorK<4,8>::
         intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x10].occluded8 =
         CurveNiIntersectorK<4,8>::
         occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x12].intersect1 =
         CurveNiIntersector1<4>::
         intersect_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x12].occluded1 =
         CurveNiIntersector1<4>::
         occluded_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x12].intersect4 =
         CurveNiIntersectorK<4,4>::
         intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x12].occluded4 =
         CurveNiIntersectorK<4,4>::
         occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x12].intersect8 =
         CurveNiIntersectorK<4,8>::
         intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector4v::function_local_static_prim.vtbl[0x12].occluded8 =
         CurveNiIntersectorK<4,8>::
         occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
    ;
    __cxa_guard_release(&VirtualCurveIntersector4v()::function_local_static_prim);
  }
  return &VirtualCurveIntersector4v::function_local_static_prim;
}

Assistant:

VirtualCurveIntersector* VirtualCurveIntersector4v()
    {
      static VirtualCurveIntersector function_local_static_prim = []()
      {
        VirtualCurveIntersector intersector;
        intersector.vtbl[Geometry::GTY_SPHERE_POINT] = SphereNiIntersectors<4>();
        intersector.vtbl[Geometry::GTY_DISC_POINT] = DiscNiIntersectors<4>();
        intersector.vtbl[Geometry::GTY_ORIENTED_DISC_POINT] = OrientedDiscNiIntersectors<4>();
        intersector.vtbl[Geometry::GTY_CONE_LINEAR_CURVE ] = LinearConeNiIntersectors<4>();
        intersector.vtbl[Geometry::GTY_ROUND_LINEAR_CURVE ] = LinearRoundConeNiIntersectors<4>();
        intersector.vtbl[Geometry::GTY_FLAT_LINEAR_CURVE ] = LinearRibbonNiIntersectors<4>();
        intersector.vtbl[Geometry::GTY_ROUND_BEZIER_CURVE] = CurveNvIntersectors <BezierCurveT,4>();
        intersector.vtbl[Geometry::GTY_FLAT_BEZIER_CURVE ] = RibbonNvIntersectors<BezierCurveT,4>();
        intersector.vtbl[Geometry::GTY_ORIENTED_BEZIER_CURVE] = OrientedCurveNiIntersectors<BezierCurveT,4>();
        intersector.vtbl[Geometry::GTY_ROUND_BSPLINE_CURVE] = CurveNvIntersectors <BSplineCurveT,4>();
        intersector.vtbl[Geometry::GTY_FLAT_BSPLINE_CURVE ] = RibbonNvIntersectors<BSplineCurveT,4>();
        intersector.vtbl[Geometry::GTY_ORIENTED_BSPLINE_CURVE] = OrientedCurveNiIntersectors<BSplineCurveT,4>();
        intersector.vtbl[Geometry::GTY_ROUND_HERMITE_CURVE] = HermiteCurveNiIntersectors <HermiteCurveT,4>();
        intersector.vtbl[Geometry::GTY_FLAT_HERMITE_CURVE ] = HermiteRibbonNiIntersectors<HermiteCurveT,4>();
        intersector.vtbl[Geometry::GTY_ORIENTED_HERMITE_CURVE] = HermiteOrientedCurveNiIntersectors<HermiteCurveT,4>();
        intersector.vtbl[Geometry::GTY_ROUND_CATMULL_ROM_CURVE] = CurveNiIntersectors <CatmullRomCurveT,4>();
        intersector.vtbl[Geometry::GTY_FLAT_CATMULL_ROM_CURVE ] = RibbonNiIntersectors<CatmullRomCurveT,4>();
        intersector.vtbl[Geometry::GTY_ORIENTED_CATMULL_ROM_CURVE] = OrientedCurveNiIntersectors<CatmullRomCurveT,4>();
        return intersector;
      }();
      return &function_local_static_prim;
    }